

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

void __thiscall Function::Function(Function *this,FunctionType type)

{
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,type);
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_00155070;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sName)._M_dataplus._M_p = (pointer)&(this->sName).field_2;
  (this->sName)._M_string_length = 0;
  (this->sName).field_2._M_local_buf[0] = '\0';
  init(this,ctx);
  setType(this,type);
  return;
}

Assistant:

Function::Function( FunctionType type )
{
	init();
	setType(type);
}